

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O2

unit_data units::precise::custom::custom_unit(uint16_t customX)

{
  byte bVar1;
  uint uVar2;
  unit_data local_1c;
  
  uVar2 = (uint)customX;
  bVar1 = (byte)(customX >> 7) & 1;
  detail::unit_data::unit_data
            (&local_1c,customX >> 6 & 4 ^ 7,(uint)bVar1 + (uint)bVar1 * 2 + -2,
             (int)(uVar2 << 0x16) >> 0x1f & 7,((int)(uVar2 << 0x19) >> 0x1f) + -3,
             (int)(uVar2 << 0x1b) >> 0x1f & 3,-2,(customX >> 4 & 2) - 2,
             (int)(uVar2 << 0x1c) >> 0x1e & 0xfffffffe,0,0,customX >> 2 & 1,customX >> 1 & 1,
             uVar2 & 1,0);
  return local_1c;
}

Assistant:

constexpr detail::unit_data custom_unit(std::uint16_t customX)
        {
            return {
                7 - 4 * bShift(customX, 8U),  // 3 or 7
                -2 + 3 * bShift(customX, 7U),  // -2 or 1
                // 7 or 0  sometimes custom unit/time is used
                7 * bShift(customX, 9U),
                // -3 or -4  this is probably the most important for
                // identifying custom units
                detail::maxNeg(detail::bitwidth::ampere) + 1 -
                    bShift(customX, 6U),
                3 * bShift(customX, 4U),  // 3 or 0
                detail::maxNeg(detail::bitwidth::mole),  // this also is set so
                                                         // that 1/-2 = -2 for a
                                                         // 2 bit signed number
                -2 + 2 * bShift(customX, 5U),
                -2 * bShift(customX, 3U),
                0,
                0,
                bShiftu(customX, 2U),
                bShiftu(customX, 1U),
                bShiftu(customX, 0U),
                0};
        }